

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

void Gia_IsoAssignOneClass3(Gia_IsoMan_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  word *pwVar5;
  undefined8 in_RAX;
  long lVar6;
  ulong uVar7;
  
  pVVar3 = p->vClasses;
  iVar1 = pVVar3->nSize;
  if ((long)iVar1 < 1) {
    __assert_fail("Vec_IntSize(p->vClasses) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                  ,0x22e,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
  }
  if (iVar1 == 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  lVar6 = (long)pVVar3->pArray[iVar1 - 2U];
  uVar2 = pVVar3->pArray[(long)iVar1 + -1];
  pVVar3->nSize = iVar1 - 2U;
  if ((int)uVar2 < 2) {
    __assert_fail("nSize > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                  ,0x234,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
  }
  piVar4 = p->pUniques;
  pwVar5 = p->pStoreW;
  uVar7 = pwVar5[lVar6] >> 0x20;
  if (uVar2 == 2) {
    if (piVar4[uVar7] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                    ,0x237,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
    }
    iVar1 = p->nUniques;
    p->nUniques = iVar1 + 1;
    piVar4[uVar7] = iVar1;
    p->nSingles = p->nSingles + 1;
    p->nEntries = p->nEntries + -1;
    uVar7 = pwVar5[lVar6 + 1] >> 0x20;
    if (piVar4[uVar7] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                    ,0x23c,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
    }
  }
  else if (piVar4[uVar7] != 0) {
    __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                  ,0x243,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
  }
  iVar1 = p->nUniques;
  p->nUniques = iVar1 + 1;
  piVar4[uVar7] = iVar1;
  p->nSingles = p->nSingles + 1;
  p->nEntries = p->nEntries + -1;
  printf("Broke ties in last class of size %d at level %d.\n",(ulong)uVar2,
         (ulong)(uint)p->pLevels[*(uint *)((long)p->pStoreW + lVar6 * 8 + 4)],in_RAX);
  return;
}

Assistant:

void Gia_IsoAssignOneClass3( Gia_IsoMan_t * p )
{
    int iBegin, nSize;
    // find the last class
    assert( Vec_IntSize(p->vClasses) > 0 );
    iBegin = Vec_IntEntry( p->vClasses, Vec_IntSize(p->vClasses) - 2 );
    nSize  = Vec_IntEntry( p->vClasses, Vec_IntSize(p->vClasses) - 1 );
    Vec_IntShrink( p->vClasses, Vec_IntSize(p->vClasses) - 2 );

    // assign the class
    assert( nSize > 1 );
    if ( nSize == 2 )
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;

        assert( p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin+1)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }
    else
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }
    printf( "Broke ties in last class of size %d at level %d.\n", nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
}